

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDFloat32x4Operation::OpFromInt32x4(SIMDValue *value)

{
  _x86_SIMDValue _Var1;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar2;
  X86SIMDValue v;
  X86SIMDValue x86Result;
  SIMDValue *value_local;
  int local_18;
  int iStack_14;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(value);
  local_18 = _Var1.field_0._0_4_;
  iStack_14 = _Var1.field_0._4_4_;
  v.field_0.f32[2] = (Type)local_18;
  v.field_0.f32[3] = (Type)iStack_14;
  aVar2 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&v.field_0 + 8));
  return (SIMDValue)aVar2;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpFromInt32x4(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // Converts the 4 signed 32-bit integer values of v.m128i_value
        // to single-precision, floating-point values.
        x86Result.m128_value = _mm_cvtepi32_ps(v.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }